

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDnsDomainNameRecord>::copyAppend
          (QGenericArrayOps<QDnsDomainNameRecord> *this,QDnsDomainNameRecord *b,
          QDnsDomainNameRecord *e)

{
  QDnsDomainNameRecord *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QDnsDomainNameRecord *in_RDI;
  QDnsDomainNameRecord *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QDnsDomainNameRecord>::begin
                        ((QArrayDataPointer<QDnsDomainNameRecord> *)0x368fb7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QDnsDomainNameRecord::QDnsDomainNameRecord(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d.d.ptr =
           (QDnsDomainNameRecordPrivate *)
           ((long)&((in_RDI[2].d.d.ptr)->super_QDnsRecordPrivate).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int> + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }